

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

uint32_t direct_get(aec_stream_conflict *strm,int n)

{
  internal_state_conflict *piVar1;
  int iVar2;
  int b;
  internal_state_conflict *state;
  int n_local;
  aec_stream_conflict *strm_local;
  
  piVar1 = strm->state;
  if (piVar1->bitp < n) {
    iVar2 = 0x3f - piVar1->bitp >> 3;
    if (iVar2 == 6) {
      piVar1->acc = piVar1->acc << 0x30 | (ulong)*strm->next_in << 0x28 |
                    (ulong)strm->next_in[1] << 0x20 | (ulong)strm->next_in[2] << 0x18 |
                    (ulong)strm->next_in[3] << 0x10 | (ulong)strm->next_in[4] << 8 |
                    (ulong)strm->next_in[5];
    }
    else if (iVar2 == 7) {
      piVar1->acc = piVar1->acc << 0x38 | (ulong)*strm->next_in << 0x30 |
                    (ulong)strm->next_in[1] << 0x28 | (ulong)strm->next_in[2] << 0x20 |
                    (ulong)strm->next_in[3] << 0x18 | (ulong)strm->next_in[4] << 0x10 |
                    (ulong)strm->next_in[5] << 8 | (ulong)strm->next_in[6];
    }
    else if (iVar2 == 5) {
      piVar1->acc = piVar1->acc << 0x28 | (ulong)*strm->next_in << 0x20 |
                    (ulong)strm->next_in[1] << 0x18 | (ulong)strm->next_in[2] << 0x10 |
                    (ulong)strm->next_in[3] << 8 | (ulong)strm->next_in[4];
    }
    else if (iVar2 == 4) {
      piVar1->acc = piVar1->acc << 0x20 | (ulong)*strm->next_in << 0x18 |
                    (ulong)strm->next_in[1] << 0x10 | (ulong)strm->next_in[2] << 8 |
                    (ulong)strm->next_in[3];
    }
    else if (iVar2 == 3) {
      piVar1->acc = piVar1->acc << 0x18 | (ulong)*strm->next_in << 0x10 |
                    (ulong)strm->next_in[1] << 8 | (ulong)strm->next_in[2];
    }
    else if (iVar2 == 2) {
      piVar1->acc = piVar1->acc << 0x10 | (ulong)*strm->next_in << 8 | (ulong)strm->next_in[1];
    }
    else if (iVar2 == 1) {
      piVar1->acc = piVar1->acc << 8 | (ulong)*strm->next_in;
    }
    strm->next_in = strm->next_in + iVar2;
    strm->avail_in = strm->avail_in - (long)iVar2;
    piVar1->bitp = iVar2 * 8 + piVar1->bitp;
  }
  piVar1->bitp = piVar1->bitp - n;
  return (uint)(piVar1->acc >> ((byte)piVar1->bitp & 0x3f)) &
         (uint)(0xffffffffffffffff >> (0x40U - (char)n & 0x3f));
}

Assistant:

static inline uint32_t direct_get(struct aec_stream *strm, int n)
{
    /**
       Get n bit from input stream

       No checking whatsoever. Read bits are dumped.
     */

    struct internal_state *state = strm->state;
    if (state->bitp < n)
    {
        int b = (63 - state->bitp) >> 3;
        if (b == 6) {
            state->acc = (state->acc << 48)
                | ((uint64_t)strm->next_in[0] << 40)
                | ((uint64_t)strm->next_in[1] << 32)
                | ((uint64_t)strm->next_in[2] << 24)
                | ((uint64_t)strm->next_in[3] << 16)
                | ((uint64_t)strm->next_in[4] << 8)
                | (uint64_t)strm->next_in[5];
        } else if (b == 7) {
            state->acc = (state->acc << 56)
                | ((uint64_t)strm->next_in[0] << 48)
                | ((uint64_t)strm->next_in[1] << 40)
                | ((uint64_t)strm->next_in[2] << 32)
                | ((uint64_t)strm->next_in[3] << 24)
                | ((uint64_t)strm->next_in[4] << 16)
                | ((uint64_t)strm->next_in[5] << 8)
                | (uint64_t)strm->next_in[6];
        } else if (b == 5) {
            state->acc = (state->acc << 40)
                | ((uint64_t)strm->next_in[0] << 32)
                | ((uint64_t)strm->next_in[1] << 24)
                | ((uint64_t)strm->next_in[2] << 16)
                | ((uint64_t)strm->next_in[3] << 8)
                | (uint64_t)strm->next_in[4];
        } else if (b == 4) {
            state->acc = (state->acc << 32)
                | ((uint64_t)strm->next_in[0] << 24)
                | ((uint64_t)strm->next_in[1] << 16)
                | ((uint64_t)strm->next_in[2] << 8)
                | (uint64_t)strm->next_in[3];
        } else if (b == 3) {
            state->acc = (state->acc << 24)
                | ((uint64_t)strm->next_in[0] << 16)
                | ((uint64_t)strm->next_in[1] << 8)
                | (uint64_t)strm->next_in[2];
        } else if (b == 2) {
            state->acc = (state->acc << 16)
                | ((uint64_t)strm->next_in[0] << 8)
                | (uint64_t)strm->next_in[1];
        } else if (b == 1) {
            state->acc = (state->acc << 8)
                | (uint64_t)strm->next_in[0];
        }
        strm->next_in += b;
        strm->avail_in -= b;
        state->bitp += b << 3;
    }

    state->bitp -= n;
    return (state->acc >> state->bitp) & (UINT64_MAX >> (64 - n));
}